

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3PagerRollback(Pager *pPager)

{
  byte bVar1;
  int iVar2;
  int eState;
  int rc2;
  int rc;
  Pager *pPager_local;
  
  if (pPager->eState == '\x06') {
    pPager_local._4_4_ = pPager->errCode;
  }
  else if (pPager->eState < 2) {
    pPager_local._4_4_ = 0;
  }
  else {
    iVar2 = pagerUseWal(pPager);
    if (iVar2 == 0) {
      if ((pPager->jfd->pMethods == (sqlite3_io_methods *)0x0) || (pPager->eState == '\x02')) {
        bVar1 = pPager->eState;
        eState = pager_end_transaction(pPager,0,0);
        if ((pPager->memDb == '\0') && (2 < bVar1)) {
          pPager->errCode = 4;
          pPager->eState = '\x06';
          return eState;
        }
      }
      else {
        eState = pager_playback(pPager,0);
      }
    }
    else {
      eState = sqlite3PagerSavepoint(pPager,2,-1);
      iVar2 = pager_end_transaction(pPager,(uint)pPager->setMaster,0);
      if (eState == 0) {
        eState = iVar2;
      }
    }
    pPager_local._4_4_ = pager_error(pPager,eState);
  }
  return pPager_local._4_4_;
}

Assistant:

SQLITE_PRIVATE int sqlite3PagerRollback(Pager *pPager){
  int rc = SQLITE_OK;                  /* Return code */
  PAGERTRACE(("ROLLBACK %d\n", PAGERID(pPager)));

  /* PagerRollback() is a no-op if called in READER or OPEN state. If
  ** the pager is already in the ERROR state, the rollback is not 
  ** attempted here. Instead, the error code is returned to the caller.
  */
  assert( assert_pager_state(pPager) );
  if( pPager->eState==PAGER_ERROR ) return pPager->errCode;
  if( pPager->eState<=PAGER_READER ) return SQLITE_OK;

  if( pagerUseWal(pPager) ){
    int rc2;
    rc = sqlite3PagerSavepoint(pPager, SAVEPOINT_ROLLBACK, -1);
    rc2 = pager_end_transaction(pPager, pPager->setMaster, 0);
    if( rc==SQLITE_OK ) rc = rc2;
  }else if( !isOpen(pPager->jfd) || pPager->eState==PAGER_WRITER_LOCKED ){
    int eState = pPager->eState;
    rc = pager_end_transaction(pPager, 0, 0);
    if( !MEMDB && eState>PAGER_WRITER_LOCKED ){
      /* This can happen using journal_mode=off. Move the pager to the error 
      ** state to indicate that the contents of the cache may not be trusted.
      ** Any active readers will get SQLITE_ABORT.
      */
      pPager->errCode = SQLITE_ABORT;
      pPager->eState = PAGER_ERROR;
      return rc;
    }
  }else{
    rc = pager_playback(pPager, 0);
  }

  assert( pPager->eState==PAGER_READER || rc!=SQLITE_OK );
  assert( rc==SQLITE_OK || rc==SQLITE_FULL || rc==SQLITE_CORRUPT
          || rc==SQLITE_NOMEM || (rc&0xFF)==SQLITE_IOERR );

  /* If an error occurs during a ROLLBACK, we can no longer trust the pager
  ** cache. So call pager_error() on the way out to make any error persistent.
  */
  return pager_error(pPager, rc);
}